

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O1

int generate_input(uint8_t *buf,int len)

{
  int in_EAX;
  uint uVar1;
  ulong uVar2;
  
  if (0 < len) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      buf[uVar2] = (char)(uVar1 / 0xfb) * '\x05' + (char)uVar1;
      uVar2 = uVar2 + 1;
      uVar1 = uVar1 + 1;
      in_EAX = len;
    } while ((uint)len != uVar2);
  }
  return in_EAX;
}

Assistant:

int generate_input(uint8_t *buf, int len)
{
	for (int i = 0; i < len; i++) {
		buf[i] = i % TEST_INPUT_MODULO;
	}
}